

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *arg)

{
  SPIRType *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  char *direction;
  string local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [32];
  
  pSVar1 = Compiler::expression_type(&this->super_Compiler,(arg->id).id);
  direction = "";
  if (pSVar1->pointer == true) {
    if ((arg->write_count == 0) || (arg->read_count == 0)) {
      if (arg->write_count != 0) {
        direction = "out ";
      }
    }
    else {
      direction = "inout ";
    }
  }
  (*(this->super_Compiler)._vptr_Compiler[0x31])(local_40,this,(ulong)(arg->id).id);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_80,this,(ulong)(arg->id).id,1);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
  (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_60,this,pSVar1,local_80);
  join<char_const*&,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&direction,(char **)local_40,&local_60,ts_2);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	// glslangValidator seems to make all arguments pointer no matter what which is rather bizarre ...
	auto &type = expression_type(arg.id);
	const char *direction = "";

	if (type.pointer)
	{
		if (arg.write_count && arg.read_count)
			direction = "inout ";
		else if (arg.write_count)
			direction = "out ";
	}

	return join(direction, to_qualifiers_glsl(arg.id), variable_decl(type, to_name(arg.id), arg.id));
}